

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aircraft.cpp
# Opt level: O0

void __thiscall
XPMP2::Aircraft::Aircraft
          (Aircraft *this,string *_icaoType,string *_icaoAirline,string *_livery,
          XPMPPlaneID _modeS_id,string *_cslId)

{
  string *in_RCX;
  string *in_RDX;
  Aircraft *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  CSLModel *unaff_retaddr;
  XPMPInfoTexts_t *in_stack_ffffffffffffff48;
  value_type_conflict1 *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffff60;
  SndChTy *local_88;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar1;
  XPMPPlaneID _modeS_id_00;
  undefined4 in_stack_ffffffffffffffd8;
  
  *in_RDI = &PTR__Aircraft_0046e1b8;
  *(undefined4 *)(in_RDI + 1) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 2));
  std::__cxx11::string::string((string *)(in_RDI + 6));
  std::__cxx11::string::string((string *)(in_RDI + 10));
  *(undefined8 *)((long)in_RDI + 0x7c) = 0;
  *(undefined8 *)((long)in_RDI + 0x84) = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  *(undefined4 *)(in_RDI + 0xe) = 0x1c;
  *(undefined4 *)((long)in_RDI + 0x8c) = 0;
  *(undefined4 *)(in_RDI + 0x12) = 0;
  *(undefined4 *)((long)in_RDI + 0x94) = 0;
  *(undefined1 *)(in_RDI + 0x13) = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::size
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)DR_NAMES);
  uVar1 = 0;
  std::allocator<float>::allocator((allocator<float> *)0x32aaee);
  std::vector<float,_std::allocator<float>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (allocator_type *)in_stack_ffffffffffffff48);
  std::allocator<float>::~allocator((allocator<float> *)0x32ab19);
  std::__cxx11::string::string((string *)(in_RDI + 0x17));
  *(undefined4 *)(in_RDI + 0x1b) = 0x3f800000;
  *(undefined4 *)((long)in_RDI + 0xdc) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined4 *)((long)in_RDI + 0xe4) = 0x3f800000;
  *(undefined1 *)(in_RDI + 0x1d) = 1;
  *(undefined4 *)((long)in_RDI + 0xec) = 0x3f800000;
  *(undefined4 *)(in_RDI + 0x1e) = 0x3f000000;
  *(undefined1 *)((long)in_RDI + 0xf4) = 0;
  *(undefined4 *)(in_RDI + 0x1f) = 1;
  XPMPPlaneRadar_t::XPMPPlaneRadar_t((XPMPPlaneRadar_t *)(in_RDI + 0x20));
  std::__cxx11::list<void_*,_std::allocator<void_*>_>::list
            ((list<void_*,_std::allocator<void_*>_> *)0x32abc9);
  *(undefined4 *)(in_RDI + 0x26) = 0;
  *(undefined4 *)((long)in_RDI + 0x134) = 5;
  *(undefined4 *)(in_RDI + 0x27) = 0x19;
  wakeTy::wakeTy((wakeTy *)((long)in_RDI + 0x13c));
  XPMPInfoTexts_t::XPMPInfoTexts_t(in_stack_ffffffffffffff48);
  *(undefined1 *)(in_RDI + 0x3e) = 1;
  *(undefined1 *)((long)in_RDI + 0x1f1) = 1;
  *(undefined1 *)((long)in_RDI + 0x1f2) = 1;
  in_RDI[0x3f] = 0;
  *(undefined4 *)(in_RDI + 0x40) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x204) = 0;
  *(undefined4 *)(in_RDI + 0x41) = 0;
  *(undefined4 *)((long)in_RDI + 0x20c) = 0;
  *(undefined4 *)(in_RDI + 0x42) = 0;
  *(undefined4 *)((long)in_RDI + 0x214) = 0;
  *(undefined4 *)(in_RDI + 0x43) = 0;
  in_RDI[0x44] = 0x7ff8000000000000;
  in_RDI[0x45] = 0x7ff8000000000000;
  in_RDI[0x46] = 0x7ff8000000000000;
  *(undefined4 *)(in_RDI + 0x47) = 0x7fc00000;
  std::__cxx11::list<void_*,_std::allocator<void_*>_>::list
            ((list<void_*,_std::allocator<void_*>_> *)0x32acca);
  *(undefined4 *)(in_RDI + 0x4b) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x25c) = 0;
  *(undefined4 *)(in_RDI + 0x4c) = 0;
  *(undefined4 *)((long)in_RDI + 0x264) = 0;
  in_RDI[0x4d] = 0;
  *(undefined4 *)(in_RDI + 0x4e) = 0;
  *(undefined4 *)((long)in_RDI + 0x274) = 0;
  *(undefined4 *)(in_RDI + 0x4f) = 0;
  *(undefined4 *)((long)in_RDI + 0x27c) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x50));
  *(undefined4 *)(in_RDI + 0x54) = 0x32;
  local_88 = (SndChTy *)(in_RDI + 0x55);
  do {
    SndChTy::SndChTy(local_88);
    _modeS_id_00 = (XPMPPlaneID)((ulong)in_R9 >> 0x20);
    local_88 = local_88 + 1;
  } while (local_88 != (SndChTy *)(in_RDI + 100));
  *(undefined1 *)(in_RDI + 100) = 0;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)0x32adaa);
  *(undefined4 *)(in_RDI + 0x68) = 0;
  *(undefined1 *)((long)in_RDI + 0x344) = 0;
  Create(in_RSI,in_RDX,in_RCX,(string *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),_modeS_id_00,
         (string *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),unaff_retaddr);
  return;
}

Assistant:

Aircraft::Aircraft(const std::string& _icaoType,
                   const std::string& _icaoAirline,
                   const std::string& _livery,
                   XPMPPlaneID _modeS_id,
                   const std::string& _cslId) :
drawInfo({sizeof(drawInfo), 0.0f, 0.0f, 0.0f, 0.0f, 0.0f, 0.0f}),
// create an approrpiately sized 'v' array and initialize with zeroes
v(DR_NAMES.size(), 0.0f)
{
    // Create the plane right away
    Create(_icaoType, _icaoAirline, _livery, _modeS_id, _cslId);
}